

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O2

void __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
::try_to_store_message_from_timer_to_queue
          (mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
           *this,type_index *msg_type,message_ref_t *message,invocation_type_t demand_type)

{
  overflow_reaction_t oVar1;
  anon_class_24_3_b3d561ce logging_lambda;
  demand_t *d;
  deliver_op_tracer tracer;
  unique_lock<std::mutex> lock;
  undefined8 in_stack_ffffffffffffff80;
  tracer_t *ptVar2;
  mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
  *pmVar3;
  unique_lock<std::mutex> local_50;
  undefined1 *local_40;
  mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
  *pmStack_38;
  type_index *local_30;
  
  ptVar2 = (this->super_mchain_tracing_enabled_base).m_tracer;
  pmVar3 = this;
  std::unique_lock<std::mutex>::unique_lock(&local_50,&this->m_lock);
  if (this->m_status != closed) {
    if ((this->m_queue).m_max_size == (this->m_queue).m_size) {
      oVar1 = (this->m_capacity).m_overflow_reaction;
      if (0xfffffffd < oVar1 - remove_oldest) {
        impl::msg_tracing_helpers::mchain_tracing_enabled_base::deliver_op_tracer::
        overflow_drop_newest((deliver_op_tracer *)&stack0xffffffffffffff88);
        goto LAB_00254beb;
      }
      if (oVar1 == remove_oldest) {
        d = details::limited_preallocated_demand_queue::front(&this->m_queue);
        impl::msg_tracing_helpers::mchain_tracing_enabled_base::deliver_op_tracer::
        overflow_remove_oldest((deliver_op_tracer *)&stack0xffffffffffffff88,d);
        details::limited_preallocated_demand_queue::pop_front(&this->m_queue);
      }
      else {
        local_40 = &stack0xffffffffffffff88;
        logging_lambda.this =
             (mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
              *)ptVar2;
        logging_lambda.tracer = (deliver_op_tracer *)in_stack_ffffffffffffff80;
        logging_lambda.msg_type = (type_index *)pmVar3;
        pmStack_38 = this;
        local_30 = msg_type;
        so_5::details::
        abort_on_fatal_error<so_5::mchain_props::mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>::try_to_store_message_from_timer_to_queue(std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::invocation_type_t)::_lambda()_1_>
                  (logging_lambda);
      }
    }
    complete_store_message_to_queue
              (this,(deliver_op_tracer *)&stack0xffffffffffffff88,msg_type,message,demand_type);
  }
LAB_00254beb:
  std::unique_lock<std::mutex>::~unique_lock(&local_50);
  return;
}

Assistant:

void
		try_to_store_message_from_timer_to_queue(
			const std::type_index & msg_type,
			const message_ref_t & message,
			invocation_type_t demand_type )
			{
				typename TRACING_BASE::deliver_op_tracer tracer{
						*this, // as tracing base.
						*this, // as chain.
						msg_type,
						message,
						demand_type };

				std::unique_lock< std::mutex > lock{ m_lock };

				// Message cannot be stored to closed chain.
				if( details::status::closed == m_status )
					return;

				bool queue_full = m_queue.is_full();
				// NOTE: there is no awaiting on full mchain.
				// If queue full we must perform some reaction.
				if( queue_full )
					{
						const auto reaction = m_capacity.overflow_reaction();
						if( overflow_reaction_t::drop_newest == reaction ||
								overflow_reaction_t::throw_exception == reaction )
							{
								// New message must be simply ignored.
								tracer.overflow_drop_newest();
								return;
							}
						else if( overflow_reaction_t::remove_oldest == reaction )
							{
								// The oldest message must be simply removed.
								tracer.overflow_remove_oldest( m_queue.front() );
								m_queue.pop_front();
							}
						else
							{
								so_5::details::abort_on_fatal_error( [&] {
										tracer.overflow_throw_exception();
										SO_5_LOG_ERROR( m_env, log_stream ) {
											log_stream << "overflow_reaction_t::abort_app "
													"will be performed for mchain (id="
													<< m_id << "), msg_type: "
													<< msg_type.name()
													<< ". Application will be aborted"
													<< std::endl;
										}
									} );
							}
					}

				complete_store_message_to_queue(
						tracer,
						msg_type,
						message,
						demand_type );
			}